

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeGlpsolCostRow(FILE *file,HighsLogOptions *log_options,bool raw,bool is_mip,HighsInt row_id
                       ,string *objective_name,double objective_function_value)

{
  char *pcVar1;
  pointer pvVar2;
  ulong uVar3;
  undefined8 uVar4;
  byte in_CL;
  byte in_DL;
  HighsLogOptions *in_RSI;
  string *in_RDI;
  uint in_R8D;
  char *pcVar5;
  char *in_XMM0_Qa;
  array<char,_32UL> double_string;
  double double_value;
  stringstream ss;
  FILE *in_stack_fffffffffffffc90;
  string local_308 [32];
  string local_2e8 [32];
  double in_stack_fffffffffffffd38;
  double in_stack_fffffffffffffd40;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [64];
  char *local_1e8;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0;
  char *local_28;
  uint local_18;
  byte local_12;
  byte local_11;
  HighsLogOptions *local_10;
  string *local_8;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_28 = in_XMM0_Qa;
  local_18 = in_R8D;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__cxx11::string::string(local_1d0);
  std::__cxx11::stringstream::str((string *)local_1b0);
  std::__cxx11::string::~string(local_1d0);
  if ((local_11 & 1) == 0) {
    highsFormatToString_abi_cxx11_((char *)local_248,"%6d ",(ulong)local_18);
    std::operator<<(&local_1a0,local_248);
    std::__cxx11::string::~string(local_248);
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < 0xd) {
      uVar4 = std::__cxx11::string::c_str();
      highsFormatToString_abi_cxx11_((char *)local_268,"%-12s ",uVar4);
      std::operator<<(&local_1a0,local_268);
      std::__cxx11::string::~string(local_268);
    }
    else {
      uVar4 = std::__cxx11::string::c_str();
      highsFormatToString_abi_cxx11_((char *)local_288,"%s\n%20s",uVar4,"");
      std::operator<<(&local_1a0,local_288);
      std::__cxx11::string::~string(local_288);
    }
    if ((local_12 & 1) == 0) {
      highsFormatToString_abi_cxx11_(&stack0xfffffffffffffd38,"B  ");
      std::operator<<(&local_1a0,(string *)&stack0xfffffffffffffd38);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd38);
    }
    else {
      highsFormatToString_abi_cxx11_((char *)local_2a8,"   ");
      std::operator<<(&local_1a0,local_2a8);
      std::__cxx11::string::~string(local_2a8);
    }
    in_stack_fffffffffffffc90 = (FILE *)&local_1a0;
    highsFormatToString_abi_cxx11_(local_28,local_2e8,"%13.6g %13s %13s \n","");
    std::operator<<((ostream *)in_stack_fffffffffffffc90,local_2e8);
    std::__cxx11::string::~string(local_2e8);
  }
  else {
    local_1e8 = local_28;
    highsDoubleToString(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    pcVar1 = "b ";
    if ((local_12 & 1) != 0) {
      pcVar1 = "";
    }
    pvVar2 = std::array<char,_32UL>::data((array<char,_32UL> *)0x514729);
    pcVar5 = " 0";
    if ((local_12 & 1) != 0) {
      pcVar5 = "";
    }
    highsFormatToString_abi_cxx11_
              ((char *)local_228,"i %d %s%s%s\n",(ulong)local_18,pcVar1,pvVar2,pcVar5);
    std::operator<<(&local_1a0,local_228);
    std::__cxx11::string::~string(local_228);
  }
  std::__cxx11::stringstream::str();
  highsFprintfString(in_stack_fffffffffffffc90,local_10,local_8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void writeGlpsolCostRow(FILE* file, const HighsLogOptions& log_options,
                        const bool raw, const bool is_mip,
                        const HighsInt row_id, const std::string objective_name,
                        const double objective_function_value) {
  std::stringstream ss;
  ss.str(std::string());
  if (raw) {
    double double_value = objective_function_value;
    auto double_string = highsDoubleToString(
        double_value, kGlpsolSolutionValueToStringTolerance);
    // Last term of 0 for dual should (also) be blank when not MIP
    ss << highsFormatToString("i %d %s%s%s\n", (int)row_id, is_mip ? "" : "b ",
                              double_string.data(), is_mip ? "" : " 0");
  } else {
    ss << highsFormatToString("%6d ", (int)row_id);
    if (objective_name.length() <= 12) {
      ss << highsFormatToString("%-12s ", objective_name.c_str());
    } else {
      ss << highsFormatToString("%s\n%20s", objective_name.c_str(), "");
    }
    if (is_mip) {
      ss << highsFormatToString("   ");
    } else {
      ss << highsFormatToString("B  ");
    }
    ss << highsFormatToString("%13.6g %13s %13s \n", objective_function_value,
                              "", "");
  }
  highsFprintfString(file, log_options, ss.str());
}